

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,inf_or_nan_writer *f)

{
  byte bVar1;
  undefined2 uVar2;
  type pcVar3;
  char __tmp;
  size_t __len;
  size_t __n;
  size_t __len_1;
  char *pcVar4;
  ulong uVar5;
  
  uVar5 = (ulong)spec->width_;
  __n = uVar5 - size;
  if (uVar5 < size || __n == 0) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,size);
    if (f->sign != '\0') {
      *pcVar3 = f->sign;
      pcVar3 = pcVar3 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar3[2] = f->str[2];
    *(undefined2 *)pcVar3 = uVar2;
    return;
  }
  pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar5);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar5 = __n >> 1;
    if (1 < __n) {
      memset(pcVar3,(uint)bVar1,uVar5);
      pcVar3 = pcVar3 + uVar5;
    }
    if (f->sign != '\0') {
      *pcVar3 = f->sign;
      pcVar3 = pcVar3 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar3[2] = f->str[2];
    *(undefined2 *)pcVar3 = uVar2;
    __n = __n - uVar5;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar4 = pcVar3 + __n;
      memset(pcVar3,(uint)bVar1,__n);
      if (f->sign != '\0') {
        *pcVar4 = f->sign;
        pcVar4 = pcVar4 + 1;
      }
      uVar2 = *(undefined2 *)f->str;
      pcVar4[2] = f->str[2];
      *(undefined2 *)pcVar4 = uVar2;
      return;
    }
    if (f->sign != '\0') {
      *pcVar3 = f->sign;
      pcVar3 = pcVar3 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar3[2] = f->str[2];
    *(undefined2 *)pcVar3 = uVar2;
  }
  memset(pcVar3 + 3,(uint)bVar1,__n);
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}